

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pragma_source_text_group(CTcTokenizer *this)

{
  size_t sVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  
  if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) !=
      (undefined1  [3440])0x0) {
    return;
  }
  tVar2 = next_on_line(this);
  if (tVar2 == TOKT_EOF) {
    iVar3 = 1;
LAB_0024e5eb:
    CTcParser::set_source_text_group_mode(G_prs,iVar3);
  }
  else {
    if (tVar2 == TOKT_LPAR) {
      tVar2 = next_on_line(this);
      if (tVar2 == TOKT_SYM) {
        sVar1 = (this->curtok_).text_len_;
        if (sVar1 == 3) {
          iVar3 = bcmp((this->curtok_).text_,"off",3);
          if (iVar3 == 0) {
            iVar3 = 0;
            goto LAB_0024e61a;
          }
        }
        else if ((sVar1 == 2) && (*(short *)(this->curtok_).text_ == 0x6e6f)) {
          iVar3 = 1;
LAB_0024e61a:
          tVar2 = next_on_line(this);
          if (tVar2 == TOKT_RPAR) goto LAB_0024e5eb;
        }
      }
    }
    log_warning(0x271f);
  }
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pragma_source_text_group()
{
    tc_toktyp_t tok;
    int f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;

    /* get the '(' token and the on/off token, if present */
    if ((tok = next_on_line()) == TOKT_EOF)
    {
        /* no on/off - by default it's on */
        f = TRUE;
    }
    else if (tok == TOKT_LPAR && next_on_line() == TOKT_SYM)
    {
        /* get the on/off mode */
        if (curtok_.get_text_len() == 2
            && memcmp(curtok_.get_text(), "on", 2) == 0)
        {
            /* it's 'on' */
            f = TRUE;
        }
        else if (curtok_.get_text_len() == 3
                 && memcmp(curtok_.get_text(), "off", 3) == 0)
        {
            /* it's 'off' */
            f = FALSE;
        }
        else
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }

        /* make sure we have the ')' token */
        if (next_on_line() != TOKT_RPAR)
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }
    }
    else
    {
        /* anything else is invalid syntax */
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode in the parser */
    G_prs->set_source_text_group_mode(f);

done:
    /* done - discard this line buffer */
    clear_linebuf();
}